

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenerator::InfoT::GetUInt(InfoT *this,string *key,uint *value,bool required)

{
  bool bVar1;
  UInt UVar2;
  string local_68;
  string_view local_48;
  Value *local_38;
  Value *jval;
  uint *puStack_28;
  bool required_local;
  uint *value_local;
  string *key_local;
  InfoT *this_local;
  
  jval._7_1_ = required;
  puStack_28 = value;
  value_local = (uint *)key;
  key_local = (string *)this;
  local_38 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isUInt(local_38);
  if (bVar1) {
    UVar2 = Json::Value::asUInt(local_38);
    *puStack_28 = UVar2;
  }
  else {
    bVar1 = Json::Value::isNull(local_38);
    if ((!bVar1) || ((jval._7_1_ & 1) != 0)) {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[29]>
                (&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local,
                 (char (*) [29])0x1009f46);
      local_48 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
      this_local._7_1_ = LogError(this,local_48);
      std::__cxx11::string::~string((string *)&local_68);
      goto LAB_009ad772;
    }
  }
  this_local._7_1_ = 1;
LAB_009ad772:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetUInt(std::string const& key,
                                       unsigned int& value,
                                       bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (jval.isUInt()) {
    value = jval.asUInt();
  } else {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not an unsigned integer."));
    }
  }
  return true;
}